

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O2

void __thiscall
FMB::FiniteModelMultiSorted::eliminateSortFunctionsAndPredicates
          (FiniteModelMultiSorted *this,Stack<unsigned_int> *sortFunctions,
          Stack<unsigned_int> *sortPredicates)

{
  uint uVar1;
  uint uVar2;
  uint val;
  Symbol *pSVar3;
  int *piVar4;
  bool bVar5;
  OperatorType *pOVar6;
  TermList TVar7;
  uint *puVar8;
  uint i;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint j_1;
  uint uVar13;
  ulong uVar14;
  uint j;
  uint uVar15;
  long lVar16;
  ulong size;
  uint local_1b4;
  DArray<unsigned_int> args;
  DArray<unsigned_int> old_sizes;
  DArray<unsigned_int> old_args;
  type old_p_interpretation;
  type old_f_offsets;
  type old_p_offsets;
  type old_f_interpretation;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> new_to_old;
  DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> f_range;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> old_to_new;
  
  uVar10 = 0;
  do {
    if ((ulong)((long)sortFunctions->_cursor - (long)sortFunctions->_stack >> 2) <= (ulong)uVar10) {
      uVar10 = 0;
      do {
        if ((ulong)((long)sortPredicates->_cursor - (long)sortPredicates->_stack >> 2) <=
            (ulong)uVar10) {
          return;
        }
        uVar12 = (ulong)sortPredicates->_stack[uVar10];
        pOVar6 = Kernel::Signature::Symbol::predType
                           (*(Symbol **)(*(long *)(DAT_00a14190 + 0x80) + uVar12 * 8));
        uVar15 = 0;
        TVar7 = Kernel::OperatorType::arg(pOVar6,0);
        uVar1 = *(uint *)(TVar7._content + 8);
        new_to_old._timestamp = 1;
        f_range._map._20_8_ = 0;
        f_range._map._28_8_ = 0;
        f_range._map._afterLast._4_4_ = 0;
        f_range._map._size = 0;
        f_range._map._deleted = 0;
        f_range._map._capacityIndex = 0;
        f_range._map._capacity = 0;
        new_to_old._20_8_ = 0;
        new_to_old._28_8_ = 0;
        new_to_old._size = 0;
        new_to_old._deleted = 0;
        new_to_old._capacityIndex = 0;
        new_to_old._capacity = 0;
        new_to_old._afterLast._4_4_ = 0;
        uVar2 = (this->_sizes)._array[uVar1];
        uVar13 = (this->_p_offsets)._array[uVar12];
        f_range._map._timestamp = new_to_old._timestamp;
        for (uVar11 = 1; uVar11 <= uVar2; uVar11 = uVar11 + 1) {
          if ((this->_p_interpretation)._array[uVar13] == '\x02') {
            uVar15 = uVar15 + 1;
            Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                       &f_range,uVar15,uVar11);
            Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      (&new_to_old,uVar11,uVar15);
          }
          uVar13 = uVar13 + 1;
        }
        if (uVar2 != uVar15) {
          Lib::DArray<unsigned_int>::DArray((DArray<unsigned_int> *)&old_to_new,&this->_f_offsets);
          Lib::DArray<unsigned_int>::DArray(&old_f_offsets,&this->_f_interpretation);
          Lib::DArray<unsigned_int>::DArray(&old_f_interpretation,&this->_p_offsets);
          Lib::DArray<char>::DArray((DArray<char> *)&old_p_offsets,&this->_p_interpretation);
          Lib::DArray<unsigned_int>::DArray
                    ((DArray<unsigned_int> *)&old_p_interpretation,&this->_sizes);
          (this->_sizes)._array[uVar1] = uVar15;
          initTables(this);
          uVar12 = 0;
          local_1b4 = 0;
          while( true ) {
            if (((ulong)(*(long *)(DAT_00a14190 + 0x68) - *(long *)(DAT_00a14190 + 0x60)) >> 3 &
                0xffffffff) <= uVar12) break;
            pSVar3 = *(Symbol **)(*(long *)(DAT_00a14190 + 0x60) + uVar12 * 8);
            pOVar6 = Kernel::Signature::Symbol::fnType(pSVar3);
            uVar2 = pSVar3->_arity;
            uVar9 = (ulong)uVar2;
            Lib::DArray<unsigned_int>::DArray(&old_sizes,uVar9);
            Lib::DArray<unsigned_int>::DArray(&args,uVar9);
            for (uVar14 = 0; uVar9 != uVar14; uVar14 = uVar14 + 1) {
              old_sizes._array[uVar14] = 1;
            }
            do {
              uVar13 = 0;
              for (lVar16 = 0; uVar9 * 4 - lVar16 != 0; lVar16 = lVar16 + 4) {
                TVar7 = Kernel::OperatorType::arg(pOVar6,uVar13);
                puVar8 = (uint *)((long)old_sizes._array + lVar16);
                if (*(uint *)(TVar7._content + 8) == uVar1) {
                  puVar8 = Lib::
                           DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                           get((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
                                *)&f_range,*puVar8);
                }
                *(uint *)((long)args._array + lVar16) = *puVar8;
                uVar13 = uVar13 + 1;
              }
              uVar13 = args2var(this,&args,(DArray<unsigned_int> *)&old_p_interpretation,
                                (DArray<unsigned_int> *)&old_to_new,(uint)uVar12,pOVar6);
              uVar13 = old_f_offsets._array[uVar13];
              if (uVar13 != 0) {
                uVar11 = *(uint *)(*(long *)(pOVar6->_key +
                                            ((ulong)(*(int *)pOVar6->_key - 1) * 2 + 2) * 4) + 8);
                if (uVar11 == uVar1) {
                  puVar8 = Lib::
                           DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                           get(&new_to_old,uVar13);
                  uVar13 = *puVar8;
                }
                (this->_f_interpretation)._array[local_1b4] = uVar13;
                if (((uVar9 == 0) && ((pSVar3->field_0x40 & 4) == 0)) &&
                   (piVar4 = (this->sortRepr)._array[uVar11]._array, piVar4[uVar13] == -1)) {
                  piVar4[uVar13] = (uint)uVar12;
                }
              }
              local_1b4 = local_1b4 + 1;
              uVar13 = 0;
              while( true ) {
                if (uVar2 == uVar13) goto LAB_00260a3e;
                uVar11 = old_sizes._array[uVar13];
                old_sizes._array[uVar13] = uVar11 + 1;
                TVar7 = Kernel::OperatorType::arg(pOVar6,uVar13);
                if (uVar11 + 1 <= (this->_sizes)._array[*(uint *)(TVar7._content + 8)]) break;
                old_sizes._array[uVar13] = 1;
                uVar13 = uVar13 + 1;
              }
            } while (uVar2 != uVar13);
LAB_00260a3e:
            Lib::DArray<unsigned_int>::~DArray(&args);
            Lib::DArray<unsigned_int>::~DArray(&old_sizes);
            uVar12 = uVar12 + 1;
          }
          local_1b4 = 0;
          for (uVar12 = 1;
              uVar12 < ((ulong)(*(long *)(DAT_00a14190 + 0x88) - *(long *)(DAT_00a14190 + 0x80)) >>
                        3 & 0xffffffff); uVar12 = uVar12 + 1) {
            pSVar3 = *(Symbol **)(*(long *)(DAT_00a14190 + 0x80) + uVar12 * 8);
            pOVar6 = Kernel::Signature::Symbol::predType(pSVar3);
            uVar2 = pSVar3->_arity;
            uVar9 = (ulong)uVar2;
            Lib::DArray<unsigned_int>::DArray(&old_sizes,uVar9);
            Lib::DArray<unsigned_int>::DArray(&args,uVar9);
            for (uVar14 = 0; uVar9 != uVar14; uVar14 = uVar14 + 1) {
              old_sizes._array[uVar14] = 1;
            }
            do {
              uVar13 = 0;
              for (lVar16 = 0; uVar9 * 4 - lVar16 != 0; lVar16 = lVar16 + 4) {
                TVar7 = Kernel::OperatorType::arg(pOVar6,uVar13);
                puVar8 = (uint *)((long)old_sizes._array + lVar16);
                if (*(uint *)(TVar7._content + 8) == uVar1) {
                  puVar8 = Lib::
                           DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                           get((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
                                *)&f_range,*puVar8);
                }
                *(uint *)((long)args._array + lVar16) = *puVar8;
                uVar13 = uVar13 + 1;
              }
              uVar13 = args2var(this,&args,(DArray<unsigned_int> *)&old_p_interpretation,
                                &old_f_interpretation,(uint)uVar12,pOVar6);
              uVar14 = (ulong)local_1b4;
              local_1b4 = local_1b4 + 1;
              (this->_p_interpretation)._array[uVar14] =
                   *(char *)((long)old_p_offsets._array + (ulong)uVar13);
              uVar14 = 0;
              while( true ) {
                uVar13 = (uint)uVar14;
                if (uVar2 == uVar13) goto LAB_00260bc6;
                uVar11 = old_sizes._array[uVar14];
                old_sizes._array[uVar14] = uVar11 + 1;
                TVar7 = Kernel::OperatorType::arg(pOVar6,uVar13);
                if (uVar11 + 1 <= (this->_sizes)._array[*(uint *)(TVar7._content + 8)]) break;
                old_sizes._array[uVar14] = 1;
                uVar14 = (ulong)(uVar13 + 1);
              }
            } while (uVar2 != uVar13);
LAB_00260bc6:
            Lib::DArray<unsigned_int>::~DArray(&args);
            Lib::DArray<unsigned_int>::~DArray(&old_sizes);
          }
          Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)&old_p_interpretation);
          Lib::DArray<char>::~DArray((DArray<char> *)&old_p_offsets);
          Lib::DArray<unsigned_int>::~DArray(&old_f_interpretation);
          Lib::DArray<unsigned_int>::~DArray(&old_f_offsets);
          Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)&old_to_new);
        }
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  (&new_to_old);
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   &f_range);
        uVar10 = uVar10 + 1;
      } while( true );
    }
    uVar12 = (ulong)sortFunctions->_stack[uVar10];
    pOVar6 = Kernel::Signature::Symbol::fnType
                       (*(Symbol **)(*(long *)(DAT_00a14190 + 0x60) + uVar12 * 8));
    uVar1 = *(uint *)(*(long *)(pOVar6->_key + ((ulong)(*(int *)pOVar6->_key - 1) * 2 + 2) * 4) + 8)
    ;
    new_to_old._timestamp = 1;
    f_range._map._afterLast._4_4_ = 0;
    f_range._map._20_8_ = 0;
    f_range._map._28_8_ = 0;
    f_range._map._size = 0;
    f_range._map._deleted = 0;
    f_range._map._capacityIndex = 0;
    f_range._map._capacity = 0;
    new_to_old._20_8_ = 0;
    new_to_old._28_8_ = 0;
    new_to_old._size = 0;
    new_to_old._deleted = 0;
    new_to_old._capacityIndex = 0;
    new_to_old._capacity = 0;
    new_to_old._afterLast._4_4_ = 0;
    old_to_new._afterLast._4_4_ = 0;
    old_to_new._20_8_ = 0;
    old_to_new._28_8_ = 0;
    old_to_new._size = 0;
    old_to_new._deleted = 0;
    old_to_new._capacityIndex = 0;
    old_to_new._capacity = 0;
    uVar2 = (this->_sizes)._array[uVar1];
    uVar13 = (this->_f_offsets)._array[uVar12];
    uVar11 = 0;
    f_range._map._timestamp = new_to_old._timestamp;
    old_to_new._timestamp = new_to_old._timestamp;
    for (uVar15 = 1; uVar15 <= uVar2; uVar15 = uVar15 + 1) {
      val = (this->_f_interpretation)._array[(uVar13 - 1) + uVar15];
      bVar5 = Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert(&f_range._map,val);
      if (bVar5) {
        uVar11 = uVar11 + 1;
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                  (&new_to_old,uVar11,val);
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                  (&old_to_new,val,uVar11);
      }
    }
    Lib::DArray<unsigned_int>::DArray(&old_f_offsets,&this->_f_offsets);
    Lib::DArray<unsigned_int>::DArray(&old_f_interpretation,&this->_f_interpretation);
    Lib::DArray<unsigned_int>::DArray(&old_p_offsets,&this->_p_offsets);
    Lib::DArray<char>::DArray(&old_p_interpretation,&this->_p_interpretation);
    Lib::DArray<unsigned_int>::DArray(&old_sizes,&this->_sizes);
    (this->_sizes)._array[uVar1] = uVar11;
    initTables(this);
    uVar14 = 0;
    local_1b4 = 0;
    while( true ) {
      if (((ulong)(*(long *)(DAT_00a14190 + 0x68) - *(long *)(DAT_00a14190 + 0x60)) >> 3 &
          0xffffffff) <= uVar14) break;
      pSVar3 = *(Symbol **)(*(long *)(DAT_00a14190 + 0x60) + uVar14 * 8);
      pOVar6 = Kernel::Signature::Symbol::fnType(pSVar3);
      uVar2 = pSVar3->_arity;
      size = (ulong)uVar2;
      Lib::DArray<unsigned_int>::DArray(&args,size);
      Lib::DArray<unsigned_int>::DArray(&old_args,size);
      for (uVar9 = 0; size != uVar9; uVar9 = uVar9 + 1) {
        args._array[uVar9] = 1;
      }
      do {
        uVar13 = 0;
        for (lVar16 = 0; size * 4 - lVar16 != 0; lVar16 = lVar16 + 4) {
          TVar7 = Kernel::OperatorType::arg(pOVar6,uVar13);
          puVar8 = (uint *)((long)args._array + lVar16);
          if (*(uint *)(TVar7._content + 8) == uVar1) {
            puVar8 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                     get(&new_to_old,*puVar8);
          }
          *(uint *)((long)old_args._array + lVar16) = *puVar8;
          uVar13 = uVar13 + 1;
        }
        uVar13 = args2var(this,&old_args,&old_sizes,&old_f_offsets,(uint)uVar14,pOVar6);
        uVar13 = old_f_interpretation._array[uVar13];
        if (uVar13 != 0) {
          uVar11 = *(uint *)(*(long *)(pOVar6->_key +
                                      ((ulong)(*(int *)pOVar6->_key - 1) * 2 + 2) * 4) + 8);
          if (uVar11 == uVar1) {
            puVar8 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                     get(&old_to_new,
                         old_f_interpretation._array[(uVar13 + old_f_offsets._array[uVar12]) - 1]);
            uVar13 = *puVar8;
          }
          (this->_f_interpretation)._array[local_1b4] = uVar13;
          if ((size == 0) && ((pSVar3->field_0x40 & 4) == 0)) {
            piVar4 = (this->sortRepr)._array[uVar11]._array;
            if (piVar4[uVar13] == -1) {
              piVar4[uVar13] = (uint)uVar14;
            }
          }
        }
        local_1b4 = local_1b4 + 1;
        uVar13 = 0;
        while( true ) {
          if (uVar2 == uVar13) goto LAB_002604dc;
          uVar11 = args._array[uVar13];
          args._array[uVar13] = uVar11 + 1;
          TVar7 = Kernel::OperatorType::arg(pOVar6,uVar13);
          if (uVar11 + 1 <= (this->_sizes)._array[*(uint *)(TVar7._content + 8)]) break;
          args._array[uVar13] = 1;
          uVar13 = uVar13 + 1;
        }
      } while (uVar2 != uVar13);
LAB_002604dc:
      Lib::DArray<unsigned_int>::~DArray(&old_args);
      Lib::DArray<unsigned_int>::~DArray(&args);
      uVar14 = uVar14 + 1;
    }
    local_1b4 = 0;
    uVar12 = 1;
    while( true ) {
      if (((ulong)(*(long *)(DAT_00a14190 + 0x88) - *(long *)(DAT_00a14190 + 0x80)) >> 3 &
          0xffffffff) <= uVar12) break;
      pSVar3 = *(Symbol **)(*(long *)(DAT_00a14190 + 0x80) + uVar12 * 8);
      pOVar6 = Kernel::Signature::Symbol::predType(pSVar3);
      uVar2 = pSVar3->_arity;
      uVar9 = (ulong)uVar2;
      Lib::DArray<unsigned_int>::DArray(&args,uVar9);
      Lib::DArray<unsigned_int>::DArray(&old_args,uVar9);
      for (uVar14 = 0; uVar9 != uVar14; uVar14 = uVar14 + 1) {
        args._array[uVar14] = 1;
      }
      do {
        uVar13 = 0;
        for (lVar16 = 0; uVar9 * 4 - lVar16 != 0; lVar16 = lVar16 + 4) {
          TVar7 = Kernel::OperatorType::arg(pOVar6,uVar13);
          puVar8 = (uint *)((long)args._array + lVar16);
          if (*(uint *)(TVar7._content + 8) == uVar1) {
            puVar8 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                     get(&new_to_old,*puVar8);
          }
          *(uint *)((long)old_args._array + lVar16) = *puVar8;
          uVar13 = uVar13 + 1;
        }
        uVar13 = args2var(this,&old_args,&old_sizes,&old_p_offsets,(uint)uVar12,pOVar6);
        uVar14 = (ulong)local_1b4;
        local_1b4 = local_1b4 + 1;
        (this->_p_interpretation)._array[uVar14] = old_p_interpretation._array[uVar13];
        uVar14 = 0;
        while( true ) {
          uVar13 = (uint)uVar14;
          if (uVar2 == uVar13) goto LAB_00260662;
          uVar11 = args._array[uVar14];
          args._array[uVar14] = uVar11 + 1;
          TVar7 = Kernel::OperatorType::arg(pOVar6,uVar13);
          if (uVar11 + 1 <= (this->_sizes)._array[*(uint *)(TVar7._content + 8)]) break;
          args._array[uVar14] = 1;
          uVar14 = (ulong)(uVar13 + 1);
        }
      } while (uVar2 != uVar13);
LAB_00260662:
      Lib::DArray<unsigned_int>::~DArray(&old_args);
      Lib::DArray<unsigned_int>::~DArray(&args);
      uVar12 = uVar12 + 1;
    }
    Lib::DArray<unsigned_int>::~DArray(&old_sizes);
    Lib::DArray<char>::~DArray(&old_p_interpretation);
    Lib::DArray<unsigned_int>::~DArray(&old_p_offsets);
    Lib::DArray<unsigned_int>::~DArray(&old_f_interpretation);
    Lib::DArray<unsigned_int>::~DArray(&old_f_offsets);
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap(&old_to_new)
    ;
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap(&new_to_old)
    ;
    Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&f_range._map);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void FiniteModelMultiSorted::eliminateSortFunctionsAndPredicates(const Stack<unsigned> &sortFunctions, const Stack<unsigned> &sortPredicates)
{
  // if we already started evaluating things with the model, elimination would be more complicated
  ASS_EQ(_domainConstants.size(),0);
  ASS_EQ(_domainConstantsRev.size(),0);

  // let's do functions first
  for(unsigned i = 0; i<sortFunctions.size(); i++) {
    unsigned elim_f = sortFunctions[i];
    Signature::Symbol* elim_symb = env.signature->getFunction(elim_f);
    ASS_EQ(elim_symb->arity(),1)
    unsigned srt = elim_symb->fnType()->result().term()->functor();

    DHSet<unsigned> f_range;
    DHMap<unsigned,unsigned> new_to_old;
    DHMap<unsigned,unsigned> old_to_new;

    unsigned origSize = _sizes[srt];
    unsigned newSize = 0;

    // srt's domain is getting reduced to the range of f
    {
      unsigned var = _f_offsets[elim_f];
      for(unsigned j = 1; j<=origSize; j++) {
        unsigned res = _f_interpretation[var++];
        //cout << "f(" << j << ")=" << res << endl;
        if (f_range.insert(res)) {
          newSize++;
          new_to_old.insert(newSize,res);
          old_to_new.insert(res,newSize);
        }
      }
    }

    // we will need to reencode everything

    // save the old stuff
    auto old_f_offsets        = std::move(_f_offsets);
    auto old_f_interpretation = std::move(_f_interpretation);
    auto old_p_offsets        = std::move(_p_offsets);
    auto old_p_interpretation = std::move(_p_interpretation);
    auto old_sizes = _sizes.clone();

    // update size of the affected sort
    _sizes[srt] = newSize;
    // cout << "newSize " << newSize << endl;
    initTables();

    // every function and predicate need to get reencoded
    // - arguments of sort srt now iterate over a different (likely smaller domain)
    // - function values of sort srt still need to passed through the ``disappearing'' elim_f

    unsigned var = 0; // ... var will fly linearly through all this
    for(unsigned f=0; f<env.signature->functions();f++){
      ASS_EQ(var,_f_offsets[f]);
      Signature::Symbol* symb = env.signature->getFunction(f);
      OperatorType* sig = symb->fnType();
      unsigned arity = symb->arity();

      // cout << "f = " << f << " arity= " << arity << endl;

      DArray<unsigned> args(arity); // ... args will respect the table encoding
      DArray<unsigned> old_args(arity);
      for(unsigned i=0;i<arity;i++){ args[i]=1; }

      for(;;) {
        // encode args into old_args
        for(unsigned i=0;i<arity;i++){
          unsigned i_srt = sig->arg(i).term()->functor();
          old_args[i] = (i_srt == srt) ? new_to_old.get(args[i]) : args[i];
        }

        // reencode and store
        unsigned old_var = args2var(old_args,old_sizes,old_f_offsets,f,sig);
        unsigned old_res = old_f_interpretation[old_var];

        if (old_res) { // eliminated symbols don't have reasonable values
          unsigned res_srt = sig->result().term()->functor();
          unsigned res = (res_srt == srt) ?
                            // need to first pass old_res through elim_f, before mapping to the new domain
                            old_to_new.get(old_f_interpretation[old_f_offsets[elim_f]+old_res-1]) :
                            old_res;

          _f_interpretation[var] = res;

          if (arity==0 && !symb->introduced() && sortRepr[res_srt][res] == -1){
            sortRepr[res_srt][res]=f;
          }
        }

        // move var
        var++;
        // increase args
        unsigned i;
        for(i=0;i<arity;i++) {
          args[i]++;
          if(args[i] <= _sizes[sig->arg(i).term()->functor()]){
            break;
          }
          args[i]=1;
        }
        if (i == arity) {
          break;
        }
      }
    }

    var = 0; // ... var will fly linearly through all this again (for the predicates)
    for(unsigned p=1; p<env.signature->predicates();p++){
      ASS_EQ(var,_p_offsets[p]);
      Signature::Symbol* symb = env.signature->getPredicate(p);
      OperatorType* sig = symb->predType();
      unsigned arity = symb->arity();

      // cout << "p = " << p << " arity= " << arity << endl;

      DArray<unsigned> args(arity); // ... args will respect the table encoding
      DArray<unsigned> old_args(arity);
      for(unsigned i=0;i<arity;i++){ args[i]=1; }

      for(;;) {
        // encode args into old_args
        for(unsigned i=0;i<arity;i++){
          unsigned i_srt = sig->arg(i).term()->functor();
          old_args[i] = (i_srt == srt) ? new_to_old.get(args[i]) : args[i];
        }

        // reencode and store
        unsigned old_var = args2var(old_args,old_sizes,old_p_offsets,p,sig);
        char old_res = old_p_interpretation[old_var];

        _p_interpretation[var++] = old_res; // no change for predicates

        // increase args
        unsigned i;
        for(i=0;i<arity;i++) {
          args[i]++;
          if(args[i] <= _sizes[sig->arg(i).term()->functor()]){
            break;
          }
          args[i]=1;
        }
        if (i == arity) {
          break;
        }
      }
    }
  }

  // let's do predicates now
  for(unsigned i = 0; i<sortPredicates.size(); i++) {
    unsigned elim_p = sortPredicates[i];
    Signature::Symbol* elim_symb = env.signature->getPredicate(elim_p);
    ASS_EQ(elim_symb->arity(),1)
    unsigned srt = elim_symb->predType()->arg(0).term()->functor();

    // cout << "Eliminate p = " << elim_p << endl;

    DHMap<unsigned,unsigned> new_to_old;
    DHMap<unsigned,unsigned> old_to_new;

    unsigned origSize = _sizes[srt];
    unsigned newSize = 0;

    // srt's domain is getting reduced to those elements for which p is true
    {
      unsigned var = _p_offsets[elim_p];
      for(unsigned j = 1; j<=origSize; j++) {
        char res = _p_interpretation[var++];
        // cout << "p(" << j << ")=" << (unsigned)res << endl;
        if (res == INTP_TRUE) {
          newSize++;
          new_to_old.insert(newSize,j);
          old_to_new.insert(j,newSize);
        }
      }
    }

    if (origSize == newSize)
      continue;

    // we will need to reencode everything

    // save the old stuff
    auto old_f_offsets        = std::move(_f_offsets);
    auto old_f_interpretation = std::move(_f_interpretation);
    auto old_p_offsets        = std::move(_p_offsets);
    auto old_p_interpretation = std::move(_p_interpretation);
    auto old_sizes = _sizes.clone();

    // update size of the affected sort
    _sizes[srt] = newSize;
    // cout << "origSize = " << origSize << " --> newSize = " << newSize << endl;

    initTables();

    // every function and predicate need to get reencoded
    // - arguments of sort srt now iterate over a different (likely smaller domain)

    unsigned var = 0; // ... var will fly linearly through all this
    for(unsigned f=0; f<env.signature->functions();f++){
      ASS_EQ(var,_f_offsets[f]);
      Signature::Symbol* symb = env.signature->getFunction(f);
      OperatorType* sig = symb->fnType();
      unsigned arity = symb->arity();

      // cout << "  f = " << f << " arity= " << arity << " of name " << symb->name() << endl;
      // cout << "->usageCnt() == " << symb->usageCnt() << endl;

      DArray<unsigned> args(arity); // ... args will respect the table encoding
      DArray<unsigned> old_args(arity);
      for(unsigned i=0;i<arity;i++){ args[i]=1; }

      for(;;) {
        // encode args into old_args
        for(unsigned i=0;i<arity;i++){
          unsigned i_srt = sig->arg(i).term()->functor();
          old_args[i] = (i_srt == srt) ? new_to_old.get(args[i]) : args[i];
        }

        // reencode and store
        unsigned old_var = args2var(old_args,old_sizes,old_f_offsets,f,sig);
        unsigned old_res = old_f_interpretation[old_var];

        if (old_res) { // eliminated symbols don't have reasonable values
          unsigned res_srt = sig->result().term()->functor();
          // this should be stipulated by the extra sort-predicate axioms
          ASS(res_srt != srt || old_p_interpretation[old_p_offsets[elim_p]+old_res-1] == INTP_TRUE)

          unsigned res = (res_srt == srt) ? old_to_new.get(old_res) : old_res;
          _f_interpretation[var] = res;

          if (arity==0 && !symb->introduced() && sortRepr[res_srt][res] == -1) {
            sortRepr[res_srt][res]=f;
          }
        }

        // move var
        var++;
        // increase args
        unsigned i;
        for(i=0;i<arity;i++) {
          args[i]++;
          if(args[i] <= _sizes[sig->arg(i).term()->functor()]){
            break;
          }
          args[i]=1;
        }
        if (i == arity) {
          break;
        }
      }
    }

    var = 0; // ... var will fly linearly through all this again (for the predicates)
    for(unsigned p=1; p<env.signature->predicates();p++){
      ASS_EQ(var,_p_offsets[p]);
      Signature::Symbol* symb = env.signature->getPredicate(p);
      OperatorType* sig = symb->predType();
      unsigned arity = symb->arity();

      // cout << "p = " << p << " arity= " << arity << endl;

      DArray<unsigned> args(arity); // ... args will respect the table encoding
      DArray<unsigned> old_args(arity);
      for(unsigned i=0;i<arity;i++){ args[i]=1; }

      for(;;) {
        // encode args into old_args
        for(unsigned i=0;i<arity;i++){
          unsigned i_srt = sig->arg(i).term()->functor();
          old_args[i] = (i_srt == srt) ? new_to_old.get(args[i]) : args[i];
        }

        // reencode and store
        unsigned old_var = args2var(old_args,old_sizes,old_p_offsets,p,sig);
        unsigned old_res = old_p_interpretation[old_var];

        _p_interpretation[var++] = old_res; // no change for predicates

        // increase args
        unsigned i;
        for(i=0;i<arity;i++) {
          args[i]++;
          if(args[i] <= _sizes[sig->arg(i).term()->functor()]){
            break;
          }
          args[i]=1;
        }
        if (i == arity) {
          break;
        }
      }
    }
  }
}